

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O0

void __thiscall CTxOut::CTxOut(CTxOut *this,CAmount *nValueIn,CScript *scriptPubKeyIn)

{
  long lVar1;
  undefined8 *in_RSI;
  CScript *in_RDI;
  long in_FS_OFFSET;
  CScript *in_stack_ffffffffffffffa8;
  CScript *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CScript::CScript(in_stack_ffffffffffffffa8);
  (in_RDI->super_CScriptBase)._union.indirect_contents.indirect = (char *)*in_RSI;
  CScript::operator=(in_RDI,in_stack_ffffffffffffffb0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CTxOut::CTxOut(const CAmount& nValueIn, CScript scriptPubKeyIn)
{
    nValue = nValueIn;
    scriptPubKey = scriptPubKeyIn;
}